

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O0

bool __thiscall
acto::intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::push
          (queue<acto::core::object_t,_acto::intrusive::spin_lock> *this,object_t *node)

{
  bool bVar1;
  lock_guard<acto::intrusive::spin_lock> local_20;
  lock_guard<acto::intrusive::spin_lock> g;
  object_t *node_local;
  queue<acto::core::object_t,_acto::intrusive::spin_lock> *this_local;
  
  g._M_device = (mutex_type *)node;
  std::lock_guard<acto::intrusive::spin_lock>::lock_guard(&local_20,&this->mutex_);
  if (this->tail_ == (object_t *)0x0) {
    *(mutex_type **)g._M_device = g._M_device;
  }
  else {
    *(object_t **)g._M_device = (this->tail_->super_node<acto::core::object_t>).next;
    (this->tail_->super_node<acto::core::object_t>).next = (object_t *)g._M_device;
  }
  this->tail_ = (object_t *)g._M_device;
  bVar1 = *(mutex_type **)g._M_device == g._M_device;
  std::lock_guard<acto::intrusive::spin_lock>::~lock_guard(&local_20);
  return bVar1;
}

Assistant:

bool push(T* const node) {
    std::lock_guard g(mutex_);

    if (tail_) {
      node->next = tail_->next;
      tail_->next = node;
    } else {
      node->next = node;
    }
    tail_ = node;
    return node->next == node;
  }